

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O2

void nvlist_move_string(nvlist_t *nvl,char *name,char *value)

{
  int iVar1;
  int *piVar2;
  nvpair_t *nvp;
  
  iVar1 = nvlist_error(nvl);
  if (iVar1 == 0) {
    nvp = nvpair_move_string(name,value);
    if (nvp != (nvpair_t *)0x0) {
      nvlist_move_nvpair(nvl,nvp);
      return;
    }
    piVar2 = __errno_location();
    iVar1 = 0xc;
    if (*piVar2 != 0) {
      iVar1 = *piVar2;
    }
    nvl->nvl_error = iVar1;
    *piVar2 = iVar1;
  }
  else {
    free(value);
    iVar1 = nvlist_error(nvl);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void
nvlist_move_string(nvlist_t *nvl, const char *name, char *value)
{
	nvpair_t *nvp;

	if (nvlist_error(nvl) != 0) {
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_string(name, value);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}